

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O1

void __thiscall features::truncate_to(features *this,features_value_iterator *pos)

{
  unsigned_long *puVar1;
  size_t i;
  
  i = (long)pos->_begin - (long)(this->values)._begin >> 2;
  (this->values)._end = pos->_begin;
  puVar1 = (this->indicies)._begin;
  if ((this->indicies)._end != puVar1) {
    (this->indicies)._end = puVar1 + i;
  }
  if ((this->space_names)._begin != (this->space_names)._end) {
    free_space_names(this,i);
    (this->space_names)._end = (this->space_names)._begin + i;
  }
  return;
}

Assistant:

void truncate_to(const features_value_iterator& pos)
  {
    ssize_t i = pos._begin - values.begin();
    values.end() = pos._begin;
    if (indicies.end() != indicies.begin())
      indicies.end() = indicies.begin() + i;
    if (space_names.begin() != space_names.end())
    {
      free_space_names(i);
      space_names.end() = space_names.begin() + i;
    }
  }